

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

macro_call_t try_param_macro_call(c2m_ctx_t c2m_ctx,macro_t m,token_t macro_id)

{
  pre_ctx *ppVar1;
  token_t local_48;
  token_t t2;
  token_t t1;
  macro_call_t mc;
  pre_ctx_t pre_ctx;
  token_t macro_id_local;
  macro_t m_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->pre_ctx;
  t2 = get_next_pptoken(c2m_ctx);
  local_48 = (token_t)0x0;
  while ((short)*(undefined4 *)t2 == 0x145) {
    pop_macro_call(c2m_ctx);
    t2 = get_next_pptoken(c2m_ctx);
  }
  if (((short)*(undefined4 *)t2 == 0x20) || ((short)*(undefined4 *)t2 == 10)) {
    local_48 = t2;
    t2 = get_next_pptoken(c2m_ctx);
  }
  if ((short)*(undefined4 *)t2 == 0x28) {
    c2m_ctx_local = (c2m_ctx_t)new_macro_call(m,macro_id->pos);
    find_args(c2m_ctx,(macro_call_t)c2m_ctx_local);
    VARR_macro_call_tpush(ppVar1->macro_call_stack,(macro_call_t)c2m_ctx_local);
  }
  else {
    unget_next_pptoken(c2m_ctx,t2);
    if (local_48 != (token_t)0x0) {
      unget_next_pptoken(c2m_ctx,local_48);
    }
    out_token(c2m_ctx,macro_id);
    c2m_ctx_local = (c2m_ctx_t)0x0;
  }
  return (macro_call_t)c2m_ctx_local;
}

Assistant:

static macro_call_t try_param_macro_call (c2m_ctx_t c2m_ctx, macro_t m, token_t macro_id) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_call_t mc;
  token_t t1 = get_next_pptoken (c2m_ctx), t2 = NULL;

  while (t1->code == T_EOR) {
    pop_macro_call (c2m_ctx);
    t1 = get_next_pptoken (c2m_ctx);
  }
  if (t1->code == ' ' || t1->code == '\n') {
    t2 = t1;
    t1 = get_next_pptoken (c2m_ctx);
  }
  if (t1->code != '(') { /* no args: it is not a macro call */
    unget_next_pptoken (c2m_ctx, t1);
    if (t2 != NULL) unget_next_pptoken (c2m_ctx, t2);
    out_token (c2m_ctx, macro_id);
    return NULL;
  }
  mc = new_macro_call (m, macro_id->pos);
  find_args (c2m_ctx, mc);
  VARR_PUSH (macro_call_t, macro_call_stack, mc);
  return mc;
}